

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O2

void ncnn::resize_bilinear_c3
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  short sVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  short *rows0_old;
  int *piVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  void *pvVar14;
  int *piVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  uint uVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  int *local_138;
  Mat local_c8;
  Mat local_78;
  
  uVar23 = (h + w) * 2;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)uVar23) {
    uVar11 = (ulong)uVar23 * 4;
  }
  piVar6 = (int *)operator_new__(uVar11);
  lVar13 = (long)w;
  lVar9 = (long)h;
  uVar11 = 0;
  if (0 < w) {
    uVar11 = (ulong)(uint)w;
  }
  lVar1 = lVar9 * 4 + lVar13 * 4;
  for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
    fVar3 = ((float)(int)uVar19 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
    fVar24 = floorf(fVar3);
    iVar4 = (int)fVar24;
    fVar27 = 0.0;
    bVar22 = -1 < iVar4;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    if (bVar22) {
      fVar27 = (fVar3 - (float)(int)fVar24) * 2048.0;
    }
    iVar5 = iVar4;
    if (srcw + -1 <= iVar4) {
      iVar5 = srcw + -2;
    }
    piVar6[uVar19] = iVar5 * 3;
    if (srcw + -1 <= iVar4) {
      fVar27 = 2048.0;
    }
    uVar23 = -(uint)(0.0 <= 2048.0 - fVar27);
    auVar25._0_4_ = (int)((float)(uVar23 & 0x3f000000 | ~uVar23 & 0xbf000000) + (2048.0 - fVar27));
    auVar25._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar27) & 0x3f000000 | ~-(uint)(0.0 <= fVar27) & 0xbf000000) +
              fVar27);
    auVar25._8_8_ = 0;
    auVar25 = packssdw(auVar25,auVar25);
    piVar6[lVar13 + lVar9 + uVar19] = auVar25._0_4_;
  }
  uVar19 = (ulong)(uint)h;
  if (h < 1) {
    uVar19 = 0;
  }
  local_138 = piVar6 + lVar9 + lVar13 * 2;
  for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
    fVar3 = ((float)(int)uVar20 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
    fVar24 = floorf(fVar3);
    iVar5 = (int)fVar24;
    fVar27 = 0.0;
    iVar4 = iVar5;
    if (iVar5 < 1) {
      iVar4 = 0;
    }
    if (-1 < iVar5) {
      fVar27 = (fVar3 - (float)(int)fVar24) * 2048.0;
    }
    iVar5 = iVar4;
    if (srch + -1 <= iVar4) {
      iVar5 = srch + -2;
    }
    piVar6[lVar13 + uVar20] = iVar5;
    if (srch + -1 <= iVar4) {
      fVar27 = 2048.0;
    }
    uVar23 = -(uint)(0.0 <= 2048.0 - fVar27);
    auVar26._0_4_ = (int)((float)(uVar23 & 0x3f000000 | ~uVar23 & 0xbf000000) + (2048.0 - fVar27));
    auVar26._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar27) & 0x3f000000 | ~-(uint)(0.0 <= fVar27) & 0xbf000000) +
              fVar27);
    auVar26._8_8_ = 0;
    auVar25 = packssdw(auVar26,auVar26);
    local_138[uVar20] = auVar25._0_4_;
  }
  iVar4 = w * 3 + 1;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,iVar4,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,iVar4,2,(Allocator *)0x0);
  pvVar7 = local_c8.data;
  pvVar14 = local_78.data;
  iVar4 = -2;
  for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
    iVar5 = piVar6[lVar13 + uVar20];
    pvVar8 = pvVar7;
    pvVar10 = pvVar14;
    if (iVar5 != iVar4) {
      if (iVar5 == iVar4 + 1) {
        iVar4 = (iVar5 + 1) * srcstride;
        piVar15 = piVar6;
        for (lVar16 = 0; pvVar8 = pvVar14, pvVar10 = pvVar7, uVar11 * 6 - lVar16 != 0;
            lVar16 = lVar16 + 6) {
          lVar21 = (long)*piVar15;
          iVar12 = (int)(short)piVar15[lVar13 + lVar9];
          iVar17 = (int)*(short *)((long)piVar15 + lVar1 + 2);
          *(short *)((long)pvVar7 + lVar16) =
               (short)((uint)src[lVar21 + (long)iVar4 + 3] * iVar17 +
                       (uint)src[lVar21 + iVar4] * iVar12 >> 4);
          *(short *)((long)pvVar7 + lVar16 + 2) =
               (short)((uint)src[lVar21 + (long)iVar4 + 4] * iVar17 +
                       (uint)src[lVar21 + (long)iVar4 + 1] * iVar12 >> 4);
          *(short *)((long)pvVar7 + lVar16 + 4) =
               (short)((uint)src[lVar21 + (long)iVar4 + 5] * iVar17 +
                       (uint)src[lVar21 + (long)iVar4 + 2] * iVar12 >> 4);
          piVar15 = piVar15 + 1;
        }
      }
      else {
        iVar4 = iVar5 * srcstride;
        iVar12 = (iVar5 + 1) * srcstride;
        piVar15 = piVar6;
        for (lVar16 = 0; uVar11 * 6 - lVar16 != 0; lVar16 = lVar16 + 6) {
          lVar21 = (long)*piVar15;
          iVar18 = (int)(short)piVar15[lVar13 + lVar9];
          iVar17 = (int)*(short *)((long)piVar15 + lVar1 + 2);
          *(short *)((long)pvVar7 + lVar16) =
               (short)((uint)src[lVar21 + (long)iVar4 + 3] * iVar17 +
                       (uint)src[lVar21 + iVar4] * iVar18 >> 4);
          *(short *)((long)pvVar7 + lVar16 + 2) =
               (short)((uint)src[lVar21 + (long)iVar4 + 4] * iVar17 +
                       (uint)src[lVar21 + (long)iVar4 + 1] * iVar18 >> 4);
          *(short *)((long)pvVar7 + lVar16 + 4) =
               (short)((uint)src[lVar21 + (long)iVar4 + 5] * iVar17 +
                       (uint)src[lVar21 + (long)iVar4 + 2] * iVar18 >> 4);
          *(short *)((long)pvVar14 + lVar16) =
               (short)((uint)src[lVar21 + (long)iVar12 + 3] * iVar17 +
                       (uint)src[lVar21 + iVar12] * iVar18 >> 4);
          *(short *)((long)pvVar14 + lVar16 + 2) =
               (short)((uint)src[lVar21 + (long)iVar12 + 4] * iVar17 +
                       (uint)src[lVar21 + (long)iVar12 + 1] * iVar18 >> 4);
          *(short *)((long)pvVar14 + lVar16 + 4) =
               (short)((uint)src[lVar21 + (long)iVar12 + 5] * iVar17 +
                       (uint)src[lVar21 + (long)iVar12 + 2] * iVar18 >> 4);
          piVar15 = piVar15 + 1;
        }
      }
    }
    iVar4 = *local_138;
    sVar2 = *(short *)((long)local_138 + 2);
    for (lVar16 = 0; w * 3 != (int)lVar16; lVar16 = lVar16 + 1) {
      dst[lVar16] = (uchar)(((uint)((int)*(short *)((long)pvVar8 + lVar16 * 2) * (int)(short)iVar4)
                            >> 0x10) +
                            ((uint)((int)*(short *)((long)pvVar10 + lVar16 * 2) * (int)sVar2) >>
                            0x10) + 2 >> 2);
    }
    local_138 = local_138 + 1;
    dst = dst + stride;
    pvVar7 = pvVar8;
    pvVar14 = pvVar10;
    iVar4 = iVar5;
  }
  operator_delete__(piVar6);
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c3(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;
    //     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 3;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 3 + 1, (size_t)2u);
    Mat rowsbuf1(w * 3 + 1, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 3;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p + 1, _S0, 1);
                _S0 = vld1_lane_u8(S0p + 2, _S0, 2);
                _S0 = vld1_lane_u8(S0p + 3, _S0, 3);
                _S0 = vld1_lane_u8(S0p + 4, _S0, 4);
                _S0 = vld1_lane_u8(S0p + 5, _S0, 5);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vext_s16(_S0low, vget_high_s16(_S016), 3);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[3] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[4] * a1) >> 4;
                rows0p[2] = (S0p[2] * a0 + S0p[5] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 3;
                rows1p += 3;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 3) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 3) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn > 0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p + 4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p + 4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "vdup.s16   d16, %8         \n"
                "mov        r4, #2          \n"
                "vdup.s16   d17, %9         \n"
                "vdup.s32   q12, r4         \n"
                "pld        [%0, #128]      \n"
                "vld1.s16   {d2-d3}, [%0 :128]!\n"
                "pld        [%1, #128]      \n"
                "vld1.s16   {d6-d7}, [%1 :128]!\n"
                "0:                         \n"
                "vmull.s16  q0, d2, d16     \n"
                "vmull.s16  q1, d3, d16     \n"
                "vorr.s32   q10, q12, q12   \n"
                "vorr.s32   q11, q12, q12   \n"
                "vmull.s16  q2, d6, d17     \n"
                "vmull.s16  q3, d7, d17     \n"
                "vsra.s32   q10, q0, #16    \n"
                "vsra.s32   q11, q1, #16    \n"
                "pld        [%0, #128]      \n"
                "vld1.s16   {d2-d3}, [%0 :128]!\n"
                "vsra.s32   q10, q2, #16    \n"
                "vsra.s32   q11, q3, #16    \n"
                "pld        [%1, #128]      \n"
                "vld1.s16   {d6-d7}, [%1 :128]!\n"
                "vshrn.s32  d20, q10, #2    \n"
                "vshrn.s32  d21, q11, #2    \n"
                "vqmovun.s16 d20, q10        \n"
                "vst1.8     {d20}, [%2]!    \n"
                "subs       %3, #1          \n"
                "bne        0b              \n"
                "sub        %0, #16         \n"
                "sub        %1, #16         \n"
                : "=r"(rows0p), // %0
                "=r"(rows1p), // %1
                "=r"(Dp),     // %2
                "=r"(nn)      // %3
                : "0"(rows0p),
                "1"(rows1p),
                "2"(Dp),
                "3"(nn),
                "r"(b0), // %8
                "r"(b1)  // %9
                : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain; --remain)
        {
            //             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(((short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2) >> 2);
        }

        ibeta += 2;
    }

    delete[] buf;
}